

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSpeedup.c
# Opt level: O2

uint Gia_LutDelayTraceTCEdges(Gia_Man_t *p,int iObj,float tDelta)

{
  void *pvVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  uint uVar5;
  float *pfVar6;
  long lVar7;
  float fVar8;
  float fVar9;
  int pPinPerm [32];
  float pPinDelays [32];
  
  pvVar1 = p->pLutLib;
  fVar8 = Gia_ObjTimeRequired(p,iObj);
  if (pvVar1 == (void *)0x0) {
    uVar5 = 0;
    for (lVar7 = 0; iVar3 = Gia_ObjLutSize(p,iObj), lVar7 < iVar3; lVar7 = lVar7 + 1) {
      piVar4 = Gia_ObjLutFanins(p,iObj);
      fVar9 = Gia_ObjTimeArrival(p,piVar4[lVar7]);
      uVar5 = uVar5 | (uint)(fVar8 < fVar9 + 1.0 + tDelta) << ((byte)lVar7 & 0x1f);
    }
  }
  else {
    iVar3 = *(int *)((long)pvVar1 + 0xc);
    iVar2 = Gia_ObjLutSize(p,iObj);
    pfVar6 = (float *)((long)pvVar1 + (long)iVar2 * 0x84 + 0x94);
    if (iVar3 == 0) {
      uVar5 = 0;
      for (lVar7 = 0; iVar3 = Gia_ObjLutSize(p,iObj), lVar7 < iVar3; lVar7 = lVar7 + 1) {
        piVar4 = Gia_ObjLutFanins(p,iObj);
        fVar9 = Gia_ObjTimeArrival(p,piVar4[lVar7]);
        uVar5 = uVar5 | (uint)(fVar8 < fVar9 + *pfVar6 + tDelta) << ((byte)lVar7 & 0x1f);
      }
    }
    else {
      Gia_LutDelayTraceSortPins(p,iObj,pPinPerm,pPinDelays);
      uVar5 = 0;
      for (lVar7 = 0; iVar3 = Gia_ObjLutSize(p,iObj), lVar7 < iVar3; lVar7 = lVar7 + 1) {
        Gia_ObjLutFanins(p,iObj);
        iVar3 = pPinPerm[lVar7];
        iVar2 = Gia_ObjLutFanin(p,iObj,iVar3);
        fVar9 = Gia_ObjTimeArrival(p,iVar2);
        uVar5 = uVar5 | (uint)(fVar8 < fVar9 + pfVar6[lVar7] + tDelta) << ((byte)iVar3 & 0x1f);
      }
    }
  }
  return uVar5;
}

Assistant:

unsigned Gia_LutDelayTraceTCEdges( Gia_Man_t * p, int iObj, float tDelta )
{
    If_LibLut_t * pLutLib = (If_LibLut_t *)p->pLutLib;
    int pPinPerm[32];
    float pPinDelays[32];
    float tRequired, * pDelays;
    unsigned uResult = 0;
    int k, iFanin;
    tRequired = Gia_ObjTimeRequired( p, iObj );
    if ( pLutLib == NULL )
    {
        Gia_LutForEachFanin( p, iObj, iFanin, k )
            if ( tRequired < Gia_ObjTimeArrival(p, iFanin) + 1.0 + tDelta )
                uResult |= (1 << k);
    }
    else if ( !pLutLib->fVarPinDelays )
    {
        pDelays = pLutLib->pLutDelays[Gia_ObjLutSize(p, iObj)];
        Gia_LutForEachFanin( p, iObj, iFanin, k )
            if ( tRequired < Gia_ObjTimeArrival(p, iFanin) + pDelays[0] + tDelta )
                uResult |= (1 << k);
    }
    else
    {
        pDelays = pLutLib->pLutDelays[Gia_ObjLutSize(p, iObj)];
        Gia_LutDelayTraceSortPins( p, iObj, pPinPerm, pPinDelays );
        Gia_LutForEachFanin( p, iObj, iFanin, k )
            if ( tRequired < Gia_ObjTimeArrival( p, Gia_ObjLutFanin(p, iObj,pPinPerm[k])) + pDelays[k] + tDelta )
                uResult |= (1 << pPinPerm[k]);
    }
    return uResult;
}